

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int cr_init_char_range(REParseState *s,CharRange *cr,uint32_t c)

{
  ushort uVar1;
  int iVar2;
  uint in_EDX;
  CharRange *in_RSI;
  long in_RDI;
  int i;
  int len;
  uint16_t *c_pt;
  BOOL invert;
  CharRange *in_stack_ffffffffffffffc8;
  int local_30;
  int local_4;
  
  uVar1 = *char_range_table[in_EDX >> 1];
  cr_init(in_RSI,*(void **)(in_RDI + 0x68),lre_realloc);
  for (local_30 = 0; SBORROW4(local_30,(uint)uVar1 * 2) != (int)(local_30 + (uint)uVar1 * -2) < 0;
      local_30 = local_30 + 1) {
    iVar2 = cr_add_point(in_stack_ffffffffffffffc8,0);
    if (iVar2 != 0) goto LAB_001cdb21;
  }
  if (((in_EDX & 1) == 0) || (iVar2 = cr_invert(in_stack_ffffffffffffffc8), iVar2 == 0)) {
    local_4 = 0;
  }
  else {
LAB_001cdb21:
    cr_free((CharRange *)0x1cdb2b);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int cr_init_char_range(REParseState *s, CharRange *cr, uint32_t c)
{
    BOOL invert;
    const uint16_t *c_pt;
    int len, i;
    
    invert = c & 1;
    c_pt = char_range_table[c >> 1];
    len = *c_pt++;
    cr_init(cr, s->opaque, lre_realloc);
    for(i = 0; i < len * 2; i++) {
        if (cr_add_point(cr, c_pt[i]))
            goto fail;
    }
    if (invert) {
        if (cr_invert(cr))
            goto fail;
    }
    return 0;
 fail:
    cr_free(cr);
    return -1;
}